

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O0

int av1_active_v_edge(AV1_COMP *cpi,int mi_col,int mi_step)

{
  int iVar1;
  FIRSTPASS_STATS *pFVar2;
  int in_EDX;
  int in_ESI;
  AV1_COMP *in_RDI;
  FIRSTPASS_STATS *this_frame_stats;
  AV1_COMMON *cm;
  int is_active_v_edge;
  int right_edge;
  int left_edge;
  int local_3c;
  int local_24;
  int local_20;
  int local_1c;
  
  local_1c = 0;
  local_20 = (in_RDI->common).mi_params.mi_cols;
  local_24 = 0;
  iVar1 = is_stat_consumption_stage_twopass(in_RDI);
  if (iVar1 != 0) {
    pFVar2 = read_one_frame_stats
                       (&in_RDI->ppi->twopass,(in_RDI->common).current_frame.display_order_hint);
    if (pFVar2 == (FIRSTPASS_STATS *)0x0) {
      return 1;
    }
    local_1c = (int)(pFVar2->inactive_zone_cols * 4.0);
    local_3c = local_20 - (int)(pFVar2->inactive_zone_cols * 4.0);
    if (local_3c < local_1c) {
      local_3c = local_1c;
    }
    local_20 = local_3c;
  }
  if (((in_ESI <= local_1c) && (local_1c < in_ESI + in_EDX)) ||
     ((in_ESI <= local_20 && (local_20 < in_ESI + in_EDX)))) {
    local_24 = 1;
  }
  return local_24;
}

Assistant:

int av1_active_v_edge(const AV1_COMP *cpi, int mi_col, int mi_step) {
  int left_edge = 0;
  int right_edge = cpi->common.mi_params.mi_cols;
  int is_active_v_edge = 0;

  // For two pass account for any formatting bars detected.
  if (is_stat_consumption_stage_twopass(cpi)) {
    const AV1_COMMON *const cm = &cpi->common;
    const FIRSTPASS_STATS *const this_frame_stats = read_one_frame_stats(
        &cpi->ppi->twopass, cm->current_frame.display_order_hint);
    if (this_frame_stats == NULL) return AOM_CODEC_ERROR;

    // The inactive region is specified in MBs not mi units.
    // The image edge is in the following MB row.
    left_edge += (int)(this_frame_stats->inactive_zone_cols * 4);

    right_edge -= (int)(this_frame_stats->inactive_zone_cols * 4);
    right_edge = AOMMAX(left_edge, right_edge);
  }

  if (((left_edge >= mi_col) && (left_edge < (mi_col + mi_step))) ||
      ((right_edge >= mi_col) && (right_edge < (mi_col + mi_step)))) {
    is_active_v_edge = 1;
  }
  return is_active_v_edge;
}